

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

wchar_t fl_utf8bytes(uint ucs)

{
  undefined4 local_c;
  uint ucs_local;
  
  if (ucs < 0x80) {
    local_c = L'\x01';
  }
  else if (ucs < 0x800) {
    local_c = L'\x02';
  }
  else if (ucs < 0x10000) {
    local_c = L'\x03';
  }
  else if (ucs < 0x110000) {
    local_c = L'\x04';
  }
  else {
    local_c = L'\x03';
  }
  return local_c;
}

Assistant:

int fl_utf8bytes(unsigned ucs) {
  if (ucs < 0x000080U) {
    return 1;
  } else if (ucs < 0x000800U) {
    return 2;
  } else if (ucs < 0x010000U) {
    return 3;
  } else if (ucs <= 0x10ffffU) {
    return 4;
  } else {
    return 3; /* length of the illegal character encoding */
  }
}